

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cc
# Opt level: O0

string * RemoveNewlines_abi_cxx11_(string *__return_storage_ptr__,char *in)

{
  size_t sVar1;
  ulong local_30;
  size_t i;
  size_t in_len;
  char *in_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar1 = strlen(in);
  for (local_30 = 0; local_30 < sVar1; local_30 = local_30 + 1) {
    if (in[local_30] != '\n') {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string RemoveNewlines(const char *in) {
  std::string ret;
  const size_t in_len = strlen(in);

  for (size_t i = 0; i < in_len; i++) {
    if (in[i] != '\n') {
      ret.push_back(in[i]);
    }
  }

  return ret;
}